

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_52::crashHandler(anon_unknown_52 *this,int signo,siginfo_t *info,void *context)

{
  char *pcVar1;
  void *__buf;
  char *__n;
  ArrayPtr<void_*const> trace_00;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> trace_01;
  char *in_stack_fffffffffffffe00;
  FdOutputStream local_1f0;
  undefined1 local_1d5 [37];
  String local_1b0;
  kj *local_198;
  void **ppvStack_190;
  String local_180;
  char *local_168;
  undefined1 local_160 [8];
  String message;
  void **local_140;
  kj *pkStack_138;
  ArrayPtr<void_*const> trace;
  void *traceSpace [32];
  void *context_local;
  siginfo_t *info_local;
  int signo_local;
  
  info_local._4_4_ = (int)this;
  ArrayPtr<void*>::ArrayPtr<32ul>
            ((ArrayPtr<void*> *)&message.content.disposer,(void *(*) [32])&trace.size_);
  space.size_ = 2;
  space.ptr = local_140;
  trace_00 = getStackTrace((kj *)message.content.disposer,space,(uint)context);
  local_168 = strsignal(info_local._4_4_);
  pkStack_138 = (kj *)trace_00.ptr;
  trace.ptr = (void **)trace_00.size_;
  local_198 = pkStack_138;
  ppvStack_190 = trace.ptr;
  trace_01.size_ = (size_t)context;
  trace_01.ptr = trace.ptr;
  stringifyStackTraceAddresses(&local_180,pkStack_138,trace_01);
  local_1d5._13_8_ = pkStack_138;
  local_1d5._21_8_ = trace.ptr;
  stringifyStackTrace(&local_1b0,trace_00);
  local_1d5[0] = 10;
  __n = ": ";
  str<char_const(&)[22],int&,char_const(&)[3],char*,char_const(&)[9],kj::String,kj::String,char>
            ((String *)local_160,(kj *)"*** Received signal #",
             (char (*) [22])((long)&info_local + 4),(int *)0x679aee,(char (*) [3])&local_168,
             (char **)"\nstack: ",(char (*) [9])&local_180,&local_1b0,(String *)local_1d5,
             in_stack_fffffffffffffe00);
  String::~String(&local_1b0);
  String::~String(&local_180);
  FdOutputStream::FdOutputStream(&local_1f0,2);
  pcVar1 = String::begin((String *)local_160);
  __buf = (void *)String::size((String *)local_160);
  FdOutputStream::write(&local_1f0,(int)pcVar1,__buf,(size_t)__n);
  FdOutputStream::~FdOutputStream(&local_1f0);
  _exit(1);
}

Assistant:

void crashHandler(int signo, siginfo_t* info, void* context) {
  void* traceSpace[32];

  // ignoreCount = 2 to ignore crashHandler() and signal trampoline.
  auto trace = getStackTrace(traceSpace, 2);

  auto message = kj::str("*** Received signal #", signo, ": ", strsignal(signo),
                         "\nstack: ", stringifyStackTraceAddresses(trace),
                         stringifyStackTrace(trace), '\n');

  FdOutputStream(STDERR_FILENO).write(message.begin(), message.size());
  _exit(1);
}